

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Auxiliary
          (ByteCodeWriter *this,OpCode op,RegSlot destinationRegister,uint byteOffset,int C1)

{
  code *pcVar1;
  RegSlot RVar2;
  bool bVar3;
  RegSlot RVar4;
  uint uVar5;
  undefined4 *puVar6;
  RegSlot local_2c;
  int32 local_28;
  OpLayoutAuxiliary data;
  int C1_local;
  uint byteOffset_local;
  RegSlot destinationRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  data.super_OpLayoutAuxNoReg.C1 = C1;
  data.R0 = byteOffset;
  CheckOpen(this);
  RVar4 = ConsumeReg(this,destinationRegister);
  RVar2 = data.R0;
  uVar5 = Data::GetCurrentOffset(&this->m_auxiliaryData);
  if (uVar5 <= RVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa01,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                "byteOffset < m_auxiliaryData.GetCurrentOffset()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_2c = data.R0;
  local_28 = data.super_OpLayoutAuxNoReg.C1;
  data.super_OpLayoutAuxNoReg.Offset = RVar4;
  Data::Encode(&this->m_byteCodeData,op,&local_2c,0xc,this);
  return;
}

Assistant:

void ByteCodeWriter::Auxiliary(OpCode op, RegSlot destinationRegister, uint byteOffset, int C1)
    {
        CheckOpen();
        destinationRegister = ConsumeReg(destinationRegister);

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutAuxiliary data;
        data.R0 = destinationRegister;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }